

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
BanSearchIRCCommand::trigger
          (BanSearchIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  basic_string_view<char,_std::char_traits<char>_> lhs_03;
  basic_string_view<char,_std::char_traits<char>_> lhs_04;
  basic_string_view<char,_std::char_traits<char>_> lhs_05;
  basic_string_view<char,_std::char_traits<char>_> lhs_06;
  bool bVar2;
  char cVar3;
  uint uVar4;
  long *plVar5;
  long lVar6;
  tm *ptVar7;
  undefined8 uVar8;
  char *pcVar9;
  size_type __rlen;
  long lVar10;
  size_t sVar11;
  char *pcVar12;
  undefined4 uVar13;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  basic_string_view<char,_std::char_traits<char>_> rhs_04;
  basic_string_view<char,_std::char_traits<char>_> rhs_05;
  basic_string_view<char,_std::char_traits<char>_> rhs_06;
  Entry *entry;
  undefined4 local_32c;
  string types;
  string out;
  string ip_str;
  time_t added_time;
  long *local_2a8;
  undefined8 local_2a0;
  code *local_298;
  code *local_290;
  time_t expire_time;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  string_view params;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char dateStr [256];
  char expireStr [256];
  
  pcVar12 = nick._M_str;
  sVar11 = nick._M_len;
  pcVar9 = pcVar12;
  plVar5 = (long *)RenX::BanDatabase::getEntries();
  if (parameters._M_len == 0) {
    string_printf_abi_cxx11_
              ((string *)dateStr,"There are a total of %u entries in the ban database.",
               plVar5[1] - *plVar5 >> 3);
    Jupiter::IRC::Client::sendNotice(source,sVar11,pcVar12,dateStr._8_8_,dateStr._0_8_);
    if ((char *)dateStr._0_8_ == dateStr + 0x10) {
      return;
    }
    operator_delete((void *)dateStr._0_8_,dateStr._16_8_ + 1);
    return;
  }
  if (plVar5[1] == *plVar5) {
    Jupiter::IRC::Client::sendNotice(source,sVar11,pcVar12,0x1a,"The ban database is empty!");
    return;
  }
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&command_split,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len,
             " \t","",pcVar9);
  params._M_len = command_split.second._M_len;
  params._M_str = command_split.second._M_str;
  local_2a0 = 0;
  local_2a8 = (long *)operator_new(0x18);
  *local_2a8 = (long)&local_2a8;
  local_2a8[1] = (long)&entry;
  local_2a8[2] = (long)&params;
  local_290 = std::
              _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:1888:48)>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:1888:48)>
              ::_M_manager;
  lhs_06._M_str = command_split.first._M_str;
  lhs_06._M_len = command_split.first._M_len;
  lhs_05._M_str = command_split.first._M_str;
  lhs_05._M_len = command_split.first._M_len;
  lhs_04._M_str = command_split.first._M_str;
  lhs_04._M_len = command_split.first._M_len;
  lhs_03._M_str = command_split.first._M_str;
  lhs_03._M_len = command_split.first._M_len;
  lhs_02._M_str = command_split.first._M_str;
  lhs_02._M_len = command_split.first._M_len;
  lhs_01._M_str = command_split.first._M_str;
  lhs_01._M_len = command_split.first._M_len;
  lhs_00._M_str = command_split.first._M_str;
  lhs_00._M_len = command_split.first._M_len;
  lhs._M_str = command_split.first._M_str;
  lhs._M_len = command_split.first._M_len;
  rhs._M_str = "all";
  rhs._M_len = 3;
  bVar2 = jessilib::equalsi<char,char>(lhs,rhs);
  uVar13 = 1;
  if ((!bVar2) && ((command_split.first._M_len != 1 || (*command_split.first._M_str != '*')))) {
    rhs_00._M_str = "ip";
    rhs_00._M_len = 2;
    bVar2 = jessilib::equalsi<char,char>(lhs_00,rhs_00);
    uVar13 = 2;
    if (!bVar2) {
      rhs_01._M_str = "hwid";
      rhs_01._M_len = 4;
      bVar2 = jessilib::equalsi<char,char>(lhs_01,rhs_01);
      uVar13 = 3;
      if (!bVar2) {
        rhs_02._M_str = "rdns";
        rhs_02._M_len = 4;
        bVar2 = jessilib::equalsi<char,char>(lhs_02,rhs_02);
        uVar13 = 4;
        if (!bVar2) {
          rhs_03._M_str = "steam";
          rhs_03._M_len = 5;
          bVar2 = jessilib::equalsi<char,char>(lhs_03,rhs_03);
          uVar13 = 5;
          if (!bVar2) {
            rhs_04._M_str = "name";
            rhs_04._M_len = 4;
            bVar2 = jessilib::equalsi<char,char>(lhs_04,rhs_04);
            uVar13 = 6;
            if (!bVar2) {
              rhs_05._M_str = "banner";
              rhs_05._M_len = 6;
              bVar2 = jessilib::equalsi<char,char>(lhs_05,rhs_05);
              uVar13 = 7;
              if (!bVar2) {
                rhs_06._M_str = "active";
                rhs_06._M_len = 6;
                bVar2 = jessilib::equalsi<char,char>(lhs_06,rhs_06);
                uVar13 = 8;
                if (!bVar2) {
                  params._M_len = parameters._M_len;
                  params._M_str = parameters._M_str;
                  uVar13 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  types._M_dataplus._M_p = (pointer)&types.field_2;
  types._M_string_length = 0;
  types.field_2._M_local_buf[0] = '\0';
  lVar6 = *plVar5;
  if (plVar5[1] != lVar6) {
    lVar10 = 0;
    local_32c = uVar13;
    do {
      entry = *(Entry **)(lVar6 + lVar10 * 8);
      ip_str._M_dataplus._M_p._0_4_ = uVar13;
      if (local_298 == (code *)0x0) {
        uVar8 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)types._M_dataplus._M_p != &types.field_2) {
          operator_delete(types._M_dataplus._M_p,
                          CONCAT71(types.field_2._M_allocated_capacity._1_7_,
                                   types.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != &out.field_2) {
          operator_delete(out._M_dataplus._M_p,
                          CONCAT71(out.field_2._M_allocated_capacity._1_7_,
                                   out.field_2._M_local_buf[0]) + 1);
        }
        if (local_298 != (code *)0x0) {
          (*local_298)(&local_2a8,&local_2a8,3);
        }
        _Unwind_Resume(uVar8);
      }
      cVar3 = (*local_290)(&local_2a8,&ip_str);
      if (cVar3 != '\0') {
        Jupiter::Socket::ntop4_abi_cxx11_((uint)&ip_str);
        lVar6 = (entry->timestamp).__d.__r;
        added_time = lVar6 / 1000000000;
        lVar1 = (entry->length).__r;
        if (lVar1 == 0) {
          builtin_strncpy(expireStr,"never",6);
        }
        else {
          expire_time = (lVar1 * 1000000000 + lVar6) / 1000000000;
          ptVar7 = localtime(&expire_time);
          strftime(expireStr,0x100,"%b %d %Y, %H:%M:%S",ptVar7);
        }
        ptVar7 = localtime(&added_time);
        strftime(dateStr,0x100,"%b %d %Y, %H:%M:%S",ptVar7);
        uVar13 = local_32c;
        if ((entry->flags & 0x7fff) == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&types,0,types._M_string_length," NULL;",6);
          uVar13 = local_32c;
        }
        else {
          types._M_string_length = 0;
          *types._M_dataplus._M_p = '\0';
          uVar4 = *(uint *)&entry->flags;
          if ((uVar4 >> 0xe & 1) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," rdns",5);
            uVar4 = (uint)entry->flags;
          }
          if ((char)uVar4 < '\0') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," game",5);
            uVar4 = (uint)entry->flags;
          }
          if ((uVar4 & 0x40) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," chat",5);
            uVar4 = (uint)entry->flags;
          }
          if ((uVar4 & 0x20) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," bot",4);
            uVar4 = (uint)entry->flags;
          }
          if ((uVar4 & 0x10) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," vote",5);
            uVar4 = (uint)entry->flags;
          }
          if ((uVar4 & 8) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," mine",5);
            uVar4 = (uint)entry->flags;
          }
          if ((uVar4 & 4) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," ladder",7);
            uVar4 = (uint)entry->flags;
          }
          if ((uVar4 & 2) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types," alert",6);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&types,";",1);
        }
        pcVar9 = "04in";
        if ((short)entry->flags < 0) {
          pcVar9 = "12";
        }
        string_printf_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expire_time
                   ,
                   "ID: %lu (\x03%sactive\x03); Added: %s; Expires: %s; IP: %.*s/%u; HWID: %.*s; Steam: %llu; Types:%.*s Name: %.*s; Banner: %.*s"
                   ,lVar10,pcVar9,dateStr,expireStr,ip_str._M_string_length,
                   CONCAT44(ip_str._M_dataplus._M_p._4_4_,ip_str._M_dataplus._M_p._0_4_),
                   (ulong)entry->prefix_length,(entry->hwid)._M_string_length,
                   (entry->hwid)._M_dataplus._M_p,entry->steamid,types._M_string_length,
                   types._M_dataplus._M_p,(entry->name)._M_string_length,
                   (entry->name)._M_dataplus._M_p,(entry->banner)._M_string_length,
                   (entry->banner)._M_dataplus._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &expire_time);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)expire_time != &local_278) {
          operator_delete((void *)expire_time,local_278._M_allocated_capacity + 1);
        }
        if ((entry->rdns)._M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&out,"; RDNS: ",8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&out,(entry->rdns)._M_dataplus._M_p,(entry->rdns)._M_string_length);
        }
        if ((entry->reason)._M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&out,"; Reason: ",10);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&out,(entry->reason)._M_dataplus._M_p,(entry->reason)._M_string_length);
        }
        Jupiter::IRC::Client::sendNotice
                  (source,sVar11,pcVar12,out._M_string_length,out._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(ip_str._M_dataplus._M_p._4_4_,ip_str._M_dataplus._M_p._0_4_) !=
            &ip_str.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(ip_str._M_dataplus._M_p._4_4_,ip_str._M_dataplus._M_p._0_4_),
                          ip_str.field_2._M_allocated_capacity + 1);
        }
      }
      lVar10 = lVar10 + 1;
      lVar6 = *plVar5;
    } while (lVar10 != plVar5[1] - lVar6 >> 3);
    if (out._M_string_length != 0) goto LAB_0012b02f;
  }
  Jupiter::IRC::Client::sendNotice(source,sVar11,pcVar12,0x11,"No matches found.");
LAB_0012b02f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)types._M_dataplus._M_p != &types.field_2) {
    operator_delete(types._M_dataplus._M_p,
                    CONCAT71(types.field_2._M_allocated_capacity._1_7_,types.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != &out.field_2) {
    operator_delete(out._M_dataplus._M_p,
                    CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]) +
                    1);
  }
  if (local_298 != (code *)0x0) {
    (*local_298)(&local_2a8,&local_2a8,3);
  }
  return;
}

Assistant:

void BanSearchIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	const auto& entries = RenX::banDatabase->getEntries();
	if (!parameters.empty()) {
		if (entries.size() == 0) {
			source->sendNotice(nick, "The ban database is empty!"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);

			RenX::BanDatabase::Entry *entry;
			std::string_view params = command_split.second;
			std::function<bool(unsigned int)> isMatch = [&](unsigned int type_l) -> bool {
				switch (type_l)
				{
				default:
				case 0:	// ANY
					return isMatch(1) || isMatch(2) || isMatch(3) || isMatch(4);
				case 1: // ALL
					return true;
				case 2:	// IP
					return entry->ip == Jupiter::asUnsignedInt(params); // TODO: Actually parse as an IP address...
				case 3: // HWID
					return entry->hwid == params;
				case 4: // RDNS
					return entry->rdns == params;
				case 5:	// STEAM
					return entry->steamid == Jupiter::asUnsignedLongLong(params);
				case 6:	// NAME
					return jessilib::equalsi(entry->name, params);
				case 7:	// BANNER
					return jessilib::equalsi(entry->banner, params);
				case 8:	// ACTIVE
					return Jupiter::asBool(params) == entry->is_active();
				}
			};

			unsigned int type;
			std::string_view type_str = command_split.first;
			if (jessilib::equalsi(type_str, "all"sv) || type_str == "*"sv)
				type = 1;
			else if (jessilib::equalsi(type_str, "ip"sv))
				type = 2;
			else if (jessilib::equalsi(type_str, "hwid"sv))
				type = 3;
			else if (jessilib::equalsi(type_str, "rdns"sv))
				type = 4;
			else if (jessilib::equalsi(type_str, "steam"sv))
				type = 5;
			else if (jessilib::equalsi(type_str, "name"sv))
				type = 6;
			else if (jessilib::equalsi(type_str, "banner"sv))
				type = 7;
			else if (jessilib::equalsi(type_str, "active"sv))
				type = 8;
			else
			{
				type = 0;
				params = parameters;
			}

			std::string out;
			std::string types;
			char dateStr[256];
			char expireStr[256];
			for (size_t i = 0; i != entries.size(); i++) {
				entry = entries[i].get();
				if (isMatch(type)) {
					std::string ip_str = Jupiter::Socket::ntop4(entry->ip);

					time_t added_time = std::chrono::system_clock::to_time_t(entry->timestamp);
					if (entry->length.count() != 0) {
						time_t expire_time = std::chrono::system_clock::to_time_t(entry->timestamp + entry->length);
						strftime(expireStr, sizeof(expireStr), "%b %d %Y, %H:%M:%S", localtime(&expire_time));
					}
					else {
						std::strcpy(expireStr, "never");
					}
					strftime(dateStr, sizeof(dateStr), "%b %d %Y, %H:%M:%S", localtime(&added_time));

					if ((entry->flags & 0x7FFF) == 0)
						types = " NULL;"sv;
					else
					{
						types.clear();
						if (entry->is_rdns_ban())
							types += " rdns"sv;
						if (entry->is_type_game())
							types += " game"sv;
						if (entry->is_type_chat())
							types += " chat"sv;
						if (entry->is_type_bot())
							types += " bot"sv;
						if (entry->is_type_vote())
							types += " vote"sv;
						if (entry->is_type_mine())
							types += " mine"sv;
						if (entry->is_type_ladder())
							types += " ladder"sv;
						if (entry->is_type_alert())
							types += " alert"sv;
						types += ";"sv;
					}

					out = string_printf("ID: %lu (" IRCCOLOR "%sactive" IRCCOLOR "); Added: %s; Expires: %s; IP: %.*s/%u; HWID: %.*s; Steam: %llu; Types:%.*s Name: %.*s; Banner: %.*s",
						i, entry->is_active() ? "12" : "04in", dateStr, expireStr, ip_str.size(), ip_str.data(), entry->prefix_length, entry->hwid.size(), entry->hwid.data(), entry->steamid,
						types.size(), types.data(), entry->name.size(), entry->name.data(), entry->banner.size(), entry->banner.data());

					if (!entry->rdns.empty())
					{
						out += "; RDNS: "sv;
						out += entry->rdns;
					}
					if (!entry->reason.empty())
					{
						out += "; Reason: "sv;
						out += entry->reason;
					}
					source->sendNotice(nick, out);
				}
			}
			if (out.empty())
				source->sendNotice(nick, "No matches found."sv);
		}
	}
	else
		source->sendNotice(nick, string_printf("There are a total of %u entries in the ban database.", entries.size()));
}